

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

void __thiscall
mocker::nasm::Section::
emplaceLine<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::MemoryAddr>>
          (Section *this,string *label,shared_ptr<mocker::nasm::Register> *args,
          shared_ptr<mocker::nasm::MemoryAddr> *args_1)

{
  shared_ptr<mocker::nasm::Mov> sStack_28;
  
  std::
  make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::MemoryAddr>>
            ((shared_ptr<mocker::nasm::Register> *)&sStack_28,
             (shared_ptr<mocker::nasm::MemoryAddr> *)args);
  std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
  emplace_back<std::__cxx11::string,std::shared_ptr<mocker::nasm::Mov>>
            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,label,
             &sStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }